

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

void __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::rotate
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,LinkType x,Dir dir)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  
  lVar5 = this[2].rootNode[1];
  lVar8 = lVar5 + x * 0x90;
  lVar1 = *(long *)(lVar8 + 0x78 + (ulong)(1 - dir) * 8);
  uVar6 = (ulong)dir;
  lVar2 = *(long *)(lVar5 + lVar1 * 0x90 + 0x78 + uVar6 * 8);
  *(long *)(lVar8 + 0x78 + (ulong)(1 - dir) * 8) = lVar2;
  if (lVar2 != -1) {
    *(ulong *)(lVar5 + 0x88 + lVar2 * 0x90) =
         x + 1U | *(ulong *)(lVar5 + 0x88 + lVar2 * 0x90) & 0x8000000000000000;
  }
  lVar8 = lVar1 * 0x90 + lVar5;
  puVar7 = (ulong *)(x * 0x90 + lVar5 + 0x88);
  uVar4 = *puVar7 & 0x7fffffffffffffff;
  *(ulong *)(lVar8 + 0x88) = *(ulong *)(lVar8 + 0x88) & 0x8000000000000000 | uVar4;
  if (uVar4 == 0) {
    plVar3 = this->rootNode;
  }
  else {
    lVar5 = uVar4 * 0x90 + lVar5;
    plVar3 = (long *)(lVar5 + (ulong)(*(long *)(lVar5 + -0x18 + uVar6 * 8) != x ^ dir) * 8 + -0x18);
  }
  *plVar3 = lVar1;
  *(LinkType *)(lVar8 + 0x78 + uVar6 * 8) = x;
  *puVar7 = lVar1 + 1U | *puVar7 & 0x8000000000000000;
  return;
}

Assistant:

void rotate(LinkType x, Dir dir) {
    LinkType y = getChild(x, opposite(dir));
    LinkType yDir = getChild(y, dir);
    setChild(x, opposite(dir), yDir);
    if (yDir != kNoLink) setParent(yDir, x);

    LinkType pX = getParent(x);
    setParent(y, pX);

    if (pX == kNoLink)
      rootNode = y;
    else
      setChild(pX, Dir((x != getChild(pX, dir)) ^ dir), y);

    setChild(y, dir, x);
    setParent(x, y);
  }